

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpcpp.hpp
# Opt level: O2

void __thiscall jsonrpcpp::Request::Request(Request *this,Json *json)

{
  bool bVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  bStack_38;
  
  (this->super_Entity).entity = request;
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Request_00175298;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->method_,"",(allocator<char> *)&bStack_38);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&bStack_38,(nullptr_t)0x0);
  Parameter::Parameter(&this->params_,&bStack_38);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&bStack_38);
  Id::Id(&this->id_);
  bVar1 = nlohmann::operator!=<std::nullptr_t,_0>(json,(void *)0x0);
  if (bVar1) {
    parse_json(this,json);
  }
  return;
}

Assistant:

inline Request::Request(const Json& json) : Entity(entity_t::request), method_(""), id_()
{
    if (json != nullptr)
        Request::parse_json(json);
}